

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O3

int nghttp2_pq_push(nghttp2_pq *pq,nghttp2_pq_entry *item)

{
  nghttp2_pq_entry **ptr;
  ulong uVar1;
  ulong uVar2;
  
  ptr = pq->q;
  uVar1 = pq->length;
  if (pq->capacity <= uVar1) {
    uVar1 = pq->capacity * 2;
    uVar2 = 4;
    if (4 < uVar1) {
      uVar2 = uVar1;
    }
    ptr = (nghttp2_pq_entry **)nghttp2_mem_realloc(pq->mem,ptr,uVar2 * 8);
    if (ptr == (nghttp2_pq_entry **)0x0) {
      return -0x385;
    }
    pq->capacity = uVar2;
    pq->q = ptr;
    uVar1 = pq->length;
  }
  ptr[uVar1] = item;
  item->index = uVar1;
  pq->length = uVar1 + 1;
  bubble_up(pq,uVar1);
  return 0;
}

Assistant:

int nghttp2_pq_push(nghttp2_pq *pq, nghttp2_pq_entry *item) {
  if (pq->capacity <= pq->length) {
    void *nq;
    size_t ncapacity;

    ncapacity = nghttp2_max(4, (pq->capacity * 2));

    nq = nghttp2_mem_realloc(pq->mem, pq->q,
                             ncapacity * sizeof(nghttp2_pq_entry *));
    if (nq == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }
    pq->capacity = ncapacity;
    pq->q = nq;
  }
  pq->q[pq->length] = item;
  item->index = pq->length;
  ++pq->length;
  bubble_up(pq, pq->length - 1);
  return 0;
}